

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_259311b::SADSkipx4Test_SrcAlignedByWidth_Test::
~SADSkipx4Test_SrcAlignedByWidth_Test(SADSkipx4Test_SrcAlignedByWidth_Test *this)

{
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)&(this->super_SADSkipx4Test).super_SADTestBase);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(SADSkipx4Test, SrcAlignedByWidth) {
  uint8_t *tmp_source_data = source_data_;
  source_data_ += width_;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  source_data_ = tmp_source_data;
}